

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void __thiscall embree::Device::Device(Device *this,char *cfg)

{
  bool *pbVar1;
  BVH4Factory *pBVar2;
  BVH8Factory *pBVar3;
  bool bVar4;
  bool verbose;
  CPU CVar5;
  TaskArena *pTVar6;
  BVH4Factory *this_00;
  BVH8Factory *this_01;
  undefined8 *puVar7;
  undefined *in_RCX;
  uchar *sig;
  uchar *in_R8;
  size_t in_R9;
  pointer *__ptr;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  State::State(&this->super_State);
  (this->super_State).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Device_02201778;
  (this->super_MemoryMonitorInterface)._vptr_MemoryMonitorInterface = (_func_int **)&DAT_022017f0;
  pTVar6 = (TaskArena *)operator_new(8);
  (pTVar6->arena)._M_t =
       (__uniq_ptr_data<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>,_true,_true>
        )0x0;
  (this->arena)._M_t.
  super___uniq_ptr_impl<embree::TaskArena,_std::default_delete<embree::TaskArena>_>._M_t.
  super__Tuple_impl<0UL,_embree::TaskArena_*,_std::default_delete<embree::TaskArena>_>.
  super__Head_base<0UL,_embree::TaskArena_*,_false>._M_head_impl = pTVar6;
  (this->bvh4_factory)._M_t.
  super___uniq_ptr_impl<embree::BVH4Factory,_std::default_delete<embree::BVH4Factory>_>._M_t.
  super__Tuple_impl<0UL,_embree::BVH4Factory_*,_std::default_delete<embree::BVH4Factory>_>.
  super__Head_base<0UL,_embree::BVH4Factory_*,_false>._M_head_impl = (BVH4Factory *)0x0;
  (this->bvh8_factory)._M_t.
  super___uniq_ptr_impl<embree::BVH8Factory,_std::default_delete<embree::BVH8Factory>_>._M_t.
  super__Tuple_impl<0UL,_embree::BVH8Factory_*,_std::default_delete<embree::BVH8Factory>_>.
  super__Head_base<0UL,_embree::BVH8Factory_*,_false>._M_head_impl = (BVH8Factory *)0x0;
  bVar4 = State::hasISA(&this->super_State,0x2000003);
  if (!bVar4) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"CPU does not support SSE2","");
    *puVar7 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar7 + 1) = 5;
    puVar7[2] = puVar7 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar7 + 2),local_50,local_50 + local_48);
    __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  CVar5 = getCPUModel();
  if (CVar5 < (ARM|CORE_TIGER_LAKE)) {
    in_RCX = &DAT_01feb058;
    (this->super_State).frequency_level = *(FREQUENCY_LEVEL *)(&DAT_01feb058 + (ulong)CVar5 * 4);
  }
  State::parseString(&this->super_State,cfg);
  State::verify(&this->super_State,(EVP_PKEY_CTX *)cfg,sig,(size_t)in_RCX,in_R8,in_R9);
  bVar4 = State::checkISASupport(&this->super_State);
  if (bVar4) {
    bVar4 = (this->super_State).hugepages;
    verbose = State::verbosity(&this->super_State,3);
    bVar4 = os_init(bVar4,verbose);
    pbVar1 = &(this->super_State).hugepages_success;
    *pbVar1 = (bool)(*pbVar1 & bVar4);
    setCacheSize(this,(this->super_State).tessellation_cache_size);
    if ((this->super_State).float_exceptions == true) {
      MXCSR = MXCSR & 0xffffe07f | 0x1c80;
    }
    bVar4 = State::verbosity(&this->super_State,1);
    if (bVar4) {
      print(this);
    }
    bVar4 = State::verbosity(&this->super_State,2);
    if (bVar4) {
      State::print(&this->super_State);
    }
    this_00 = (BVH4Factory *)operator_new(0x538);
    BVH4Factory::BVH4Factory
              (this_00,(this->super_State).enabled_builder_cpu_features,
               (this->super_State).enabled_cpu_features);
    pBVar2 = (this->bvh4_factory)._M_t.
             super___uniq_ptr_impl<embree::BVH4Factory,_std::default_delete<embree::BVH4Factory>_>.
             _M_t.
             super__Tuple_impl<0UL,_embree::BVH4Factory_*,_std::default_delete<embree::BVH4Factory>_>
             .super__Head_base<0UL,_embree::BVH4Factory_*,_false>._M_head_impl;
    (this->bvh4_factory)._M_t.
    super___uniq_ptr_impl<embree::BVH4Factory,_std::default_delete<embree::BVH4Factory>_>._M_t.
    super__Tuple_impl<0UL,_embree::BVH4Factory_*,_std::default_delete<embree::BVH4Factory>_>.
    super__Head_base<0UL,_embree::BVH4Factory_*,_false>._M_head_impl = this_00;
    if (pBVar2 != (BVH4Factory *)0x0) {
      operator_delete(pBVar2);
    }
    this_01 = (BVH8Factory *)operator_new(0x4a8);
    BVH8Factory::BVH8Factory
              (this_01,(this->super_State).enabled_builder_cpu_features,
               (this->super_State).enabled_cpu_features);
    pBVar3 = (this->bvh8_factory)._M_t.
             super___uniq_ptr_impl<embree::BVH8Factory,_std::default_delete<embree::BVH8Factory>_>.
             _M_t.
             super__Tuple_impl<0UL,_embree::BVH8Factory_*,_std::default_delete<embree::BVH8Factory>_>
             .super__Head_base<0UL,_embree::BVH8Factory_*,_false>._M_head_impl;
    (this->bvh8_factory)._M_t.
    super___uniq_ptr_impl<embree::BVH8Factory,_std::default_delete<embree::BVH8Factory>_>._M_t.
    super__Tuple_impl<0UL,_embree::BVH8Factory_*,_std::default_delete<embree::BVH8Factory>_>.
    super__Head_base<0UL,_embree::BVH8Factory_*,_false>._M_head_impl = this_01;
    if (pBVar3 != (BVH8Factory *)0x0) {
      operator_delete(pBVar3);
    }
    initTaskingSystem(this,(this->super_State).numThreads);
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CPU does not support selected ISA","");
  *puVar7 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar7 + 1) = 5;
  puVar7[2] = puVar7 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar7 + 2),local_50,local_50 + local_48);
  __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

Device::Device (const char* cfg) : arena(new TaskArena())
  {
    /* check that CPU supports lowest ISA */
    if (!hasISA(ISA)) {
      throw_RTCError(RTC_ERROR_UNSUPPORTED_CPU,"CPU does not support " ISA_STR);
    }

    /* set default frequency level for detected CPU */
    switch (getCPUModel()) {
    case CPU::UNKNOWN:         frequency_level = FREQUENCY_SIMD256; break;
    case CPU::XEON_ICE_LAKE:   frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_ICE_LAKE:   frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_TIGER_LAKE: frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_COMET_LAKE: frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_CANNON_LAKE:frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_KABY_LAKE:  frequency_level = FREQUENCY_SIMD256; break;
    case CPU::XEON_SKY_LAKE:   frequency_level = FREQUENCY_SIMD128; break;
    case CPU::CORE_SKY_LAKE:   frequency_level = FREQUENCY_SIMD256; break;
    case CPU::XEON_BROADWELL:  frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_BROADWELL:  frequency_level = FREQUENCY_SIMD256; break;
    case CPU::XEON_HASWELL:    frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_HASWELL:    frequency_level = FREQUENCY_SIMD256; break;
    case CPU::XEON_IVY_BRIDGE: frequency_level = FREQUENCY_SIMD256; break;
    case CPU::CORE_IVY_BRIDGE: frequency_level = FREQUENCY_SIMD256; break;
    case CPU::SANDY_BRIDGE:    frequency_level = FREQUENCY_SIMD256; break;
    case CPU::NEHALEM:         frequency_level = FREQUENCY_SIMD128; break;
    case CPU::CORE2:           frequency_level = FREQUENCY_SIMD128; break;
    case CPU::CORE1:           frequency_level = FREQUENCY_SIMD128; break;
    case CPU::XEON_PHI_KNIGHTS_MILL   : frequency_level = FREQUENCY_SIMD512; break;
    case CPU::XEON_PHI_KNIGHTS_LANDING: frequency_level = FREQUENCY_SIMD512; break;
    case CPU::ARM:             frequency_level = FREQUENCY_SIMD256; break;
    }

    /* initialize global state */
#if defined(EMBREE_CONFIG)
    State::parseString(EMBREE_CONFIG);
#endif
    State::parseString(cfg);
    State::verify();

    /* check whether selected ISA is supported by the HW, as the user could have forced an unsupported ISA */    
    if (!checkISASupport()) {
      throw_RTCError(RTC_ERROR_UNSUPPORTED_CPU,"CPU does not support selected ISA");
    }    
    
    /*! do some internal tests */
    assert(isa::Cylinder::verify());

    /*! enable huge page support if desired */
#if defined(__WIN32__)
    if (State::enable_selockmemoryprivilege)
      State::hugepages_success &= win_enable_selockmemoryprivilege(State::verbosity(3));
#endif
    State::hugepages_success &= os_init(State::hugepages,State::verbosity(3));
    
    /*! set tessellation cache size */
    setCacheSize( State::tessellation_cache_size );

    /*! enable some floating point exceptions to catch bugs */
    if (State::float_exceptions)
    {
      int exceptions = _MM_MASK_MASK;
      //exceptions &= ~_MM_MASK_INVALID;
      exceptions &= ~_MM_MASK_DENORM;
      exceptions &= ~_MM_MASK_DIV_ZERO;
      //exceptions &= ~_MM_MASK_OVERFLOW;
      //exceptions &= ~_MM_MASK_UNDERFLOW;
      //exceptions &= ~_MM_MASK_INEXACT;
      _MM_SET_EXCEPTION_MASK(exceptions);
    }
    
    /* print info header */
    if (State::verbosity(1))
      print();
    if (State::verbosity(2)) 
      State::print();

    /* register all algorithms */
    bvh4_factory = make_unique(new BVH4Factory(enabled_builder_cpu_features, enabled_cpu_features));

#if defined(EMBREE_TARGET_SIMD8)
    bvh8_factory = make_unique(new BVH8Factory(enabled_builder_cpu_features, enabled_cpu_features));
#endif

    /* setup tasking system */
    initTaskingSystem(numThreads);
  }